

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O2

void __thiscall cmCTestSubmitCommand::CheckArguments(cmCTestSubmitCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  long lVar6;
  cmCTestSubmitCommand *local_40;
  cmCTestSubmitCommand *local_38;
  
  if ((this->Parts).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    _Var4._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          &(this->Parts).
           super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_payload._M_value.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar1 = *(pointer *)
              ((long)&(this->Parts).
                      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_payload._M_value.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8);
    lVar5 = (long)pbVar1 - (long)_Var4._M_current;
    local_40 = this;
    local_38 = this;
    for (lVar6 = lVar5 >> 7; 0 < lVar6; lVar6 = lVar6 + -1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,_Var4)
      ;
      _Var3._M_current = _Var4._M_current;
      if (bVar2) goto LAB_001bd1a6;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                         _Var4._M_current + 1);
      _Var3._M_current = _Var4._M_current + 1;
      if (bVar2) goto LAB_001bd1a6;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                         _Var4._M_current + 2);
      _Var3._M_current = _Var4._M_current + 2;
      if (bVar2) goto LAB_001bd1a6;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                         _Var4._M_current + 3);
      _Var3._M_current = _Var4._M_current + 3;
      if (bVar2) goto LAB_001bd1a6;
      _Var4._M_current = _Var4._M_current + 4;
      lVar5 = lVar5 + -0x80;
    }
    lVar5 = lVar5 >> 5;
    if (lVar5 == 1) {
LAB_001bd3a4:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,_Var4)
      ;
      _Var3._M_current = _Var4._M_current;
      if (!bVar2) {
        _Var3._M_current = pbVar1;
      }
LAB_001bd1a6:
      if (_Var3._M_current != pbVar1) {
        _Var4._M_current = _Var3._M_current;
        while (_Var4._M_current = _Var4._M_current + 1, _Var4._M_current != pbVar1) {
          bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                  operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_38,
                             _Var4);
          if (!bVar2) {
            std::__cxx11::string::operator=((string *)_Var3._M_current,(string *)_Var4._M_current);
            _Var3._M_current = _Var3._M_current + 1;
          }
        }
      }
    }
    else {
      if (lVar5 == 2) {
LAB_001bd367:
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                           _Var4);
        _Var3._M_current = _Var4._M_current;
        if (!bVar2) {
          _Var4._M_current = _Var4._M_current + 1;
          goto LAB_001bd3a4;
        }
        goto LAB_001bd1a6;
      }
      _Var3._M_current = pbVar1;
      if (lVar5 == 3) {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                           _Var4);
        _Var3._M_current = _Var4._M_current;
        if (!bVar2) {
          _Var4._M_current = _Var4._M_current + 1;
          goto LAB_001bd367;
        }
        goto LAB_001bd1a6;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->Parts,(const_iterator)_Var3._M_current,
            *(pointer *)
             ((long)&(this->Parts).
                     super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_payload._M_value.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 8));
  }
  if ((this->Files).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged != true) {
    return;
  }
  _Var4._M_current =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(this->Files).
         super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_payload._M_value.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  pbVar1 = *(pointer *)
            ((long)&(this->Files).
                    super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_payload._M_value.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 8);
  lVar6 = (long)pbVar1 - (long)_Var4._M_current;
  local_40 = this;
  local_38 = this;
  for (lVar5 = lVar6 >> 7; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var4);
    _Var3._M_current = _Var4._M_current;
    if (bVar2) goto LAB_001bd304;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                       _Var4._M_current + 1);
    _Var3._M_current = _Var4._M_current + 1;
    if (bVar2) goto LAB_001bd304;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                       _Var4._M_current + 2);
    _Var3._M_current = _Var4._M_current + 2;
    if (bVar2) goto LAB_001bd304;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                       _Var4._M_current + 3);
    _Var3._M_current = _Var4._M_current + 3;
    if (bVar2) goto LAB_001bd304;
    _Var4._M_current = _Var4._M_current + 4;
    lVar6 = lVar6 + -0x80;
  }
  lVar6 = lVar6 >> 5;
  if (lVar6 == 1) {
LAB_001bd3c9:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var4);
    _Var3._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var3._M_current = pbVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_001bd388:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var4);
    _Var3._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_001bd3c9;
    }
  }
  else {
    _Var3._M_current = pbVar1;
    if (lVar6 != 3) goto LAB_001bd342;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var4);
    _Var3._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_001bd388;
    }
  }
LAB_001bd304:
  if (_Var3._M_current != pbVar1) {
    _Var4._M_current = _Var3._M_current;
    while (_Var4._M_current = _Var4._M_current + 1, _Var4._M_current != pbVar1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_38,_Var4)
      ;
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)_Var3._M_current,(string *)_Var4._M_current);
        _Var3._M_current = _Var3._M_current + 1;
      }
    }
  }
LAB_001bd342:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&this->Files,(const_iterator)_Var3._M_current,
          *(pointer *)
           ((long)&(this->Files).
                   super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_payload._M_value.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8));
  return;
}

Assistant:

void cmCTestSubmitCommand::CheckArguments()
{
  if (this->Parts) {
    cm::erase_if(*(this->Parts), [this](std::string const& arg) -> bool {
      cmCTest::Part p = this->CTest->GetPartFromName(arg);
      if (p == cmCTest::PartCount) {
        std::ostringstream e;
        e << "Part name \"" << arg << "\" is invalid.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }

  if (this->Files) {
    cm::erase_if(*(this->Files), [this](std::string const& arg) -> bool {
      if (!cmSystemTools::FileExists(arg)) {
        std::ostringstream e;
        e << "File \"" << arg << "\" does not exist. Cannot submit "
          << "a non-existent file.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }
}